

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.cc
# Opt level: O3

void matras_vers_test(void)

{
  pointer puVar1;
  pointer puVar2;
  void *pvVar3;
  uint uVar4;
  int iVar5;
  unsigned_long *puVar6;
  undefined8 extraout_RAX;
  long lVar7;
  matras_id_t id;
  uint uVar8;
  matras_stats *pmVar9;
  size_t sVar10;
  matras_view *pmVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  code *apcStack_190 [2];
  long lStack_180;
  undefined1 local_178 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> comps [8];
  matras local;
  matras_id_t tmp;
  unsigned_long local_40;
  int local_38;
  int local_34;
  
  uVar13 = 1;
  lStack_180 = 0x1033fe;
  plan(1);
  lStack_180 = 0x10340d;
  _space(_stdout);
  lStack_180 = 0x103422;
  printf("# *** %s ***\n");
  lStack_180 = 0x103435;
  memset(local_178,0,0xc0);
  extents_in_use = 0;
  lStack_180 = 0x10345a;
  matras_create((matras *)
                &comps[7].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,8,&ver_allocator,(matras_stats *)0x0);
  local_38 = 10;
  local_40 = 0;
  local_34 = 1;
  do {
    iVar14 = 0;
    do {
      lStack_180 = 0x103478;
      uVar4 = rand();
      if ((uVar4 & 0xf) == 0) {
        if (local_34 == 1) {
LAB_0010365f:
          uVar4 = 0;
          if (~vermask != 0) {
            for (; ((uint)~vermask >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
            }
          }
          vermask = vermask | 1 << (uVar4 & 0x1f);
          lStack_180 = 0x10369d;
          matras_create_read_view
                    ((matras *)
                     &comps[7].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (matras_view *)((long)&views[0].root + (ulong)(uVar4 << 5)));
          if ((ulong)uVar4 == 0) {
LAB_001038e0:
            lStack_180 = 0x1038e5;
            matras_vers_test();
            lVar7 = 0xc0;
            do {
              pvVar3 = *(void **)((long)apcStack_190 + lVar7);
              if (pvVar3 != (void *)0x0) {
                lStack_180 = 0x103919;
                operator_delete(pvVar3,*(long *)((long)&lStack_180 + lVar7) - (long)pvVar3);
              }
              lVar7 = lVar7 + -0x18;
            } while (lVar7 != 0);
            lStack_180 = (long)matras_gh_1145_test;
            _Unwind_Resume(extraout_RAX);
          }
          lStack_180 = 0x1036c1;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     &comps[(ulong)uVar4 - 1].
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_178);
          local_34 = local_34 + 1;
          uVar13 = uVar13 | 1 << ((byte)uVar4 & 0x1f);
        }
        else {
          if (local_34 != 8) {
            lStack_180 = 0x1035ca;
            uVar4 = rand();
            if ((uVar4 & 1) == 0) goto LAB_0010365f;
          }
          do {
            lStack_180 = 0x1035d7;
            iVar5 = rand();
            uVar4 = iVar5 % 7 + 1;
          } while ((uVar13 >> (uVar4 & 0x1f) & 1) == 0);
          lStack_180 = 0x10362a;
          matras_destroy_read_view
                    ((matras *)
                     &comps[7].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,views + (int)uVar4);
          uVar8 = ~(1 << ((byte)uVar4 & 0x1f));
          vermask = vermask & uVar8;
          puVar1 = comps[(long)(int)uVar4 + -1].
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          if (comps[(int)uVar4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start != puVar1) {
            comps[(int)uVar4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start = puVar1;
          }
          local_34 = local_34 + -1;
          uVar13 = uVar13 & uVar8;
        }
      }
      else {
        lStack_180 = 0x103489;
        uVar4 = rand();
        if (((uVar4 & 7) == 0) &&
           ((undefined1  [8])
            comps[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != local_178)) {
          lStack_180 = 0x1034a9;
          matras_dealloc((matras *)
                         &comps[7].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
          comps[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start =
               comps[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start + -1;
        }
        lStack_180 = 0x1034b6;
        iVar5 = rand();
        id = (matras_id_t)((long)iVar5 % (long)local_38);
        uVar12 = (ulong)(int)id;
        if ((ulong)((long)comps[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start - (long)local_178 >> 3) <=
            uVar12) {
          pmVar9 = (matras_stats *)(local_40 * 10000);
          do {
            local.stats = pmVar9;
            if (comps[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start ==
                comps[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              lStack_180 = 0x103519;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
              _M_realloc_insert<unsigned_long>
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_178,
                         (iterator)
                         comps[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start,(unsigned_long *)&local.stats);
            }
            else {
              *comps[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start = (unsigned_long)pmVar9;
              comps[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start =
                   comps[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start + 1;
            }
            lStack_180 = 0x103528;
            puVar6 = (unsigned_long *)
                     matras_alloc((matras *)
                                  &comps[7].
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (matras_id_t *)&local.stats);
            *puVar6 = (unsigned_long)pmVar9;
            pmVar9 = (matras_stats *)((long)&pmVar9->extent_count + 1);
          } while ((ulong)((long)comps[0].
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start - (long)local_178 >> 3) <=
                   uVar12);
        }
        local_40 = local_40 + 1;
        *(unsigned_long *)((long)local_178 + uVar12 * 8) = local_40;
        lStack_180 = 0x103569;
        matras_touch((matras *)
                     &comps[7].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,id);
        if (local.head.root <= (void *)((long)iVar5 % (long)local_38 & 0xffffffffU)) {
LAB_001038b7:
          lStack_180 = 0x1038d6;
          __assert_fail("id < v->block_count",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/matras.h"
                        ,0x1ab,
                        "void *matras_view_get_no_check(const struct matras *, const struct matras_view *, matras_id_t)"
                       );
        }
        *(unsigned_long *)
         (*(long *)(comps[7].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage
                    [id >> ((byte)local.capacity & 0x1f)] +
                   (ulong)((local.shift1 & id) >> (local.capacity._4_1_ & 0x1f)) * 8) +
         (ulong)((local.shift2 & id) * (int)local.head.next_view)) = local_40;
      }
      views[0].root =
           comps[7].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      views[0].block_count = (size_t)local.head.root;
      views[0].prev_view = (matras_view *)local.head.block_count;
      views[0].next_view = local.head.prev_view;
      lVar7 = 0;
      do {
        if ((uVar13 >> ((uint)lVar7 & 0x1f) & 1) != 0) {
          puVar1 = comps[lVar7 + -1].
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          puVar2 = comps[lVar7].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          sVar10 = (long)puVar2 - (long)puVar1 >> 3;
          if (sVar10 != views[lVar7].block_count) {
LAB_001038db:
            lStack_180 = 0x1038e0;
            matras_vers_test();
            goto LAB_001038e0;
          }
          if (puVar2 != puVar1) {
            pmVar11 = views + lVar7;
            if (views[lVar7].next_view == (matras_view *)0x0) {
              pmVar11 = (matras_view *)
                        &comps[7].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
            }
            uVar12 = 0;
            do {
              uVar4 = (uint)uVar12;
              if (pmVar11->block_count <= (uVar12 & 0xffffffff)) goto LAB_001038b7;
              if (puVar1[uVar12] !=
                  *(unsigned_long *)
                   (*(long *)(*(long *)((long)pmVar11->root +
                                       (ulong)(uVar4 >> ((byte)(undefined4)local.capacity & 0x1f)) *
                                       8) +
                             (ulong)((local.shift1 & uVar4) >> ((byte)local.capacity._4_4_ & 0x1f))
                             * 8) + (ulong)((local.shift2 & uVar4) * (int)local.head.next_view))) {
                lStack_180 = 0x1038db;
                matras_vers_test();
                goto LAB_001038db;
              }
              uVar12 = uVar12 + 1;
            } while (sVar10 + (sVar10 == 0) != uVar12);
          }
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 8);
      iVar14 = iVar14 + 1;
    } while (iVar14 != 800);
    local_38 = (int)((double)local_38 * 1.5);
    if (7999 < local_38) {
      lStack_180 = 0x10381f;
      matras_destroy((matras *)
                     &comps[7].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      lStack_180 = 0x103854;
      _ok((uint)(extents_in_use == 0),"extents_in_use == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0xff,
          "line %d",0xff);
      lStack_180 = 0x103863;
      _space(_stdout);
      lStack_180 = 0x103878;
      printf("# *** %s: done ***\n","matras_vers_test");
      lStack_180 = 0x10387d;
      check_plan();
      lVar7 = 0xc0;
      do {
        pvVar3 = *(void **)((long)apcStack_190 + lVar7);
        if (pvVar3 != (void *)0x0) {
          lStack_180 = 0x10389f;
          operator_delete(pvVar3,*(long *)((long)&lStack_180 + lVar7) - (long)pvVar3);
        }
        lVar7 = lVar7 + -0x18;
      } while (lVar7 != 0);
      return;
    }
  } while( true );
}

Assistant:

void
matras_vers_test()
{
	plan(1);
	header();

	std::vector<type_t> comps[MATRAS_VERSION_COUNT];
	int use_mask = 1;
	int cur_num_or_ver = 1;
	struct matras local;
	extents_in_use = 0;
	matras_create(&local, sizeof(type_t), &ver_allocator, NULL);
	type_t val = 0;
	for (int s = 10; s < 8000; s = int(s * 1.5)) {
		for (int k = 0; k < 800; k++) {
			if (rand() % 16 == 0) {
				bool add_ver;
				if (cur_num_or_ver == 1)
					add_ver = true;
				else if (cur_num_or_ver == MATRAS_VERSION_COUNT)
					add_ver = false;
				else
					add_ver = rand() % 2 == 0;
				if (add_ver) {
					cur_num_or_ver++;
					matras_id_t new_ver = reg_view_id();
					matras_create_read_view(&local, views + new_ver);
					fail_unless(new_ver > 0);
					use_mask |= (1 << new_ver);
					comps[new_ver] = comps[0];
				} else {
					cur_num_or_ver--;
					int del_ver;
					do {
						del_ver = 1 + rand() % (MATRAS_VERSION_COUNT - 1);
					} while ((use_mask & (1 << del_ver)) == 0);
					matras_destroy_read_view(&local, views + del_ver);
					unreg_view_id(del_ver);
					comps[del_ver].clear();
					use_mask &= ~(1 << del_ver);
				}
			} else {
				if (rand() % 8 == 0 && comps[0].size() > 0) {
					matras_dealloc(&local);
					comps[0].pop_back();
				}
				size_t p = rand() % s;
				type_t mod = 0;
				while (p >= comps[0].size()) {
					comps[0].push_back(val * 10000 + mod);
					matras_id_t tmp;
					type_t *ptrval = (type_t *)matras_alloc(&local, &tmp);
					*ptrval = val * 10000 + mod;
					mod++;
				}
				val++;
				comps[0][p] = val;
				matras_touch(&local, p);
				*(type_t *)matras_get(&local, p) = val;
			}
			views[0] = local.head;

			for (int i = 0; i < MATRAS_VERSION_COUNT; i++) {
				if ((use_mask & (1 << i)) == 0)
					continue;
				fail_unless(comps[i].size() == views[i].block_count);
				for (size_t j = 0; j < comps[i].size(); j++) {
					type_t val1 = comps[i][j];
					type_t val2 = *(type_t *)matras_view_get(&local, views + i, j);
					fail_unless(val1 == val2);
				}
			}
		}
	}
	matras_destroy(&local);
	ok(extents_in_use == 0);

	footer();
	check_plan();
}